

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qstyleanimation_p.cpp
# Opt level: O3

void QStyleAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  *(undefined4 *)(_o + 0x20) = 0;
  QAbstractAnimation::start((DeletionPolicy)_o);
  return;
}

Assistant:

void QStyleAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QStyleAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->start(); break;
        default: ;
        }
    }
    (void)_a;
}